

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void setptmode_all(global_State *g,GCproto *pt,int mode)

{
  GCproto *pt_00;
  long lVar1;
  
  if (((pt->flags & 1) != 0) && ((ulong)pt->sizekgc != 0)) {
    lVar1 = -(ulong)pt->sizekgc;
    do {
      pt_00 = (GCproto *)(ulong)*(uint *)((ulong)(pt->k).ptr32 + lVar1 * 4);
      if (pt_00->gct == '\a') {
        setptmode(g,pt_00,mode);
        setptmode_all(g,pt_00,mode);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

static void setptmode_all(global_State *g, GCproto *pt, int mode)
{
  ptrdiff_t i;
  if (!(pt->flags & PROTO_CHILD)) return;
  for (i = -(ptrdiff_t)pt->sizekgc; i < 0; i++) {
    GCobj *o = proto_kgc(pt, i);
    if (o->gch.gct == ~LJ_TPROTO) {
      setptmode(g, gco2pt(o), mode);
      setptmode_all(g, gco2pt(o), mode);
    }
  }
}